

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipField(CodedInputStream *input,uint32_t tag)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  uint8_t *puVar4;
  int64_t iVar5;
  int iVar6;
  uint32_t first_byte_or_zero;
  pair<unsigned_long,_bool> pVar7;
  uint32_t value_1;
  uint64_t value;
  uint32_t local_1c;
  uint64_t local_18;
  uint count;
  
  if (tag < 8) goto LAB_0039fd5b;
  bVar3 = 0;
  switch(tag & 7) {
  case 0:
    puVar4 = input->buffer_;
    if ((input->buffer_end_ <= puVar4) || ((char)*puVar4 < '\0')) {
      pVar7 = io::CodedInputStream::ReadVarint64Fallback(input);
      bVar3 = pVar7.second;
      goto switchD_0039fd85_caseD_4;
    }
    puVar4 = puVar4 + 1;
    break;
  case 1:
    if (*(int *)&input->buffer_end_ - (int)input->buffer_ < 8) {
      bVar3 = io::CodedInputStream::ReadLittleEndian64Fallback(input,&local_18);
      goto switchD_0039fd85_caseD_4;
    }
    puVar4 = input->buffer_ + 8;
    break;
  case 2:
    pbVar1 = input->buffer_;
    if (pbVar1 < input->buffer_end_) {
      bVar3 = *pbVar1;
      first_byte_or_zero = (uint32_t)bVar3;
      count = (uint)bVar3;
      if ((char)bVar3 < '\0') goto LAB_0039fe50;
      input->buffer_ = pbVar1 + 1;
      bVar3 = 0;
    }
    else {
      first_byte_or_zero = 0;
LAB_0039fe50:
      iVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      count = (uint)iVar5;
      bVar3 = (byte)((ulong)iVar5 >> 0x3f);
    }
    if (-1 < (int)count && bVar3 == 0) {
      iVar6 = *(int *)&input->buffer_end_ - (int)input->buffer_;
      if (iVar6 < (int)count) {
        bVar2 = io::CodedInputStream::SkipFallback(input,count,iVar6);
        return bVar2;
      }
      puVar4 = input->buffer_ + count;
      break;
    }
    goto LAB_0039fd5b;
  case 3:
    iVar6 = input->recursion_budget_;
    input->recursion_budget_ = iVar6 + -1;
    if ((0 < iVar6) && (bVar2 = SkipMessage(input), bVar2)) {
      if (input->recursion_budget_ < input->recursion_limit_) {
        input->recursion_budget_ = input->recursion_budget_ + 1;
      }
      bVar3 = input->last_tag_ == (tag & 0xfffffff8 | 4);
      goto switchD_0039fd85_caseD_4;
    }
LAB_0039fd5b:
    bVar3 = 0;
  default:
    goto switchD_0039fd85_caseD_4;
  case 5:
    if (*(int *)&input->buffer_end_ - (int)input->buffer_ < 4) {
      bVar3 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_1c);
      goto switchD_0039fd85_caseD_4;
    }
    puVar4 = input->buffer_ + 4;
  }
  input->buffer_ = puVar4;
  bVar3 = 1;
switchD_0039fd85_caseD_4:
  return (bool)(bVar3 & 1);
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32_t tag) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      if (!input->Skip(length)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      return true;
    }
    default: {
      return false;
    }
  }
}